

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32c.cc
# Opt level: O0

uint32_t crc32c::Extend(uint32_t crc,uint8_t *data,size_t count)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  size_t in_stack_00000018;
  uint8_t *in_stack_00000020;
  size_t in_stack_00000128;
  uint8_t *in_stack_00000130;
  uint32_t in_stack_0000013c;
  uint32_t local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (Extend(unsigned_int,unsigned_char_const*,unsigned_long)::can_use_sse42 == '\0') {
    iVar2 = __cxa_guard_acquire(&Extend(unsigned_int,unsigned_char_const*,unsigned_long)::
                                 can_use_sse42);
    if (iVar2 != 0) {
      Extend::can_use_sse42 = CanUseSse42();
      __cxa_guard_release(&Extend(unsigned_int,unsigned_char_const*,unsigned_long)::can_use_sse42);
    }
  }
  if ((Extend::can_use_sse42 & 1U) == 0) {
    local_c = ExtendPortable(count._4_4_,in_stack_00000020,in_stack_00000018);
  }
  else {
    local_c = ExtendSse42(in_stack_0000013c,in_stack_00000130,in_stack_00000128);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_c;
  }
  __stack_chk_fail();
}

Assistant:

uint32_t Extend(uint32_t crc, const uint8_t* data, size_t count) {
#if HAVE_SSE42 && (defined(_M_X64) || defined(__x86_64__))
  static bool can_use_sse42 = CanUseSse42();
  if (can_use_sse42) return ExtendSse42(crc, data, count);
#elif HAVE_ARM64_CRC32C
  static bool can_use_arm64_crc32 = CanUseArm64Crc32();
  if (can_use_arm64_crc32) return ExtendArm64(crc, data, count);
#endif  // HAVE_SSE42 && (defined(_M_X64) || defined(__x86_64__))

  return ExtendPortable(crc, data, count);
}